

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O2

RBTNode * rbt_find(RBTree *rbt,RBTNode *data)

{
  RBTNode *pRVar1;
  uint uVar2;
  RBTree *pRVar3;
  
  pRVar3 = rbt;
  while( true ) {
    pRVar1 = pRVar3->root;
    if (pRVar1 == &g_sentinel) {
      return (RBTNode *)0x0;
    }
    uVar2 = (*rbt->comparator)(data,pRVar1,rbt->comparator_arg);
    if (uVar2 == 0) break;
    pRVar3 = (RBTree *)(&pRVar1->left + (~uVar2 >> 0x1f));
  }
  return pRVar1;
}

Assistant:

RBTNode *
rbt_find(RBTree *rbt, const RBTNode *data)
{
    RBTNode    *node = rbt->root;

    while (node != RBTNIL)
    {
        int         cmp = rbt->comparator(data, node, rbt->comparator_arg);

        if (cmp == 0)
            return node;
        else if (cmp < 0)
            node = node->left;
        else
            node = node->right;
    }

    return NULL;
}